

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::internal::ReturnAction<bool>::Impl<bool,_bool_()>::Impl
          (Impl<bool,_bool_()> *this,shared_ptr<bool> *value)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<bool> *value_local;
  Impl<bool,_bool_()> *this_local;
  
  ActionInterface<bool_()>::ActionInterface(&this->super_ActionInterface<bool_()>);
  (this->super_ActionInterface<bool_()>)._vptr_ActionInterface = (_func_int **)&PTR__Impl_005bc788;
  peVar2 = std::__shared_ptr_access<bool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<bool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)value);
  this->value_before_cast_ = (bool)(*peVar2 & 1);
  bVar1 = ImplicitCast_<bool>((bool)(this->value_before_cast_ & 1));
  this->value_ = bVar1;
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}